

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::scale(PixelBufferAccess *dst,ConstPixelBufferAccess *src,FilterMode filter)

{
  int iVar1;
  int iVar2;
  TextureFormat *pTVar3;
  undefined1 local_c8 [16];
  Vec4 local_b8;
  int local_a8;
  int local_a4;
  int x_1;
  int y_1;
  int z;
  Vec4 local_8c;
  int local_7c;
  int local_78;
  int x;
  int y;
  float sZ;
  float sY;
  float sX;
  undefined1 local_58 [8];
  Sampler sampler;
  FilterMode filter_local;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  sampler._52_4_ = filter;
  unique0x100002bd = (Sampler *)src;
  Vector<float,_4>::Vector((Vector<float,_4> *)&sY,0.0,0.0,0.0,0.0);
  Sampler::Sampler((Sampler *)local_58,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,filter,filter,0.0,
                   false,COMPAREMODE_NONE,0,(Vec4 *)&sY,false,MODE_DEPTH);
  iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)stack0xffffffffffffffe8);
  iVar2 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  sZ = (float)iVar1 / (float)iVar2;
  iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)stack0xffffffffffffffe8);
  iVar2 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  y = (int)((float)iVar1 / (float)iVar2);
  iVar1 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)stack0xffffffffffffffe8);
  iVar2 = ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
  x = (int)((float)iVar1 / (float)iVar2);
  iVar1 = ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
  if ((iVar1 == 1) &&
     (iVar1 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)stack0xffffffffffffffe8),
     iVar1 == 1)) {
    for (local_78 = 0; iVar1 = local_78,
        iVar2 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess), iVar1 < iVar2
        ; local_78 = local_78 + 1) {
      for (local_7c = 0; iVar1 = local_7c,
          iVar2 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess),
          iVar1 < iVar2; local_7c = local_7c + 1) {
        pTVar3 = ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
        ConstPixelBufferAccess::sample2D
                  ((ConstPixelBufferAccess *)&y_1,stack0xffffffffffffffe8,(FilterMode)local_58,
                   ((float)local_7c + 0.5) * sZ,((float)local_78 + 0.5) * (float)y,sampler._52_4_);
        linearToSRGBIfNeeded((tcu *)&local_8c,pTVar3,(Vec4 *)&y_1);
        PixelBufferAccess::setPixel(dst,&local_8c,local_7c,local_78,0);
      }
    }
  }
  else {
    for (x_1 = 0; iVar1 = x_1,
        iVar2 = ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess), iVar1 < iVar2;
        x_1 = x_1 + 1) {
      for (local_a4 = 0; iVar1 = local_a4,
          iVar2 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess),
          iVar1 < iVar2; local_a4 = local_a4 + 1) {
        for (local_a8 = 0; iVar1 = local_a8,
            iVar2 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess),
            iVar1 < iVar2; local_a8 = local_a8 + 1) {
          pTVar3 = ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
          ConstPixelBufferAccess::sample3D
                    ((ConstPixelBufferAccess *)local_c8,stack0xffffffffffffffe8,(FilterMode)local_58
                     ,((float)local_a8 + 0.5) * sZ,((float)local_a4 + 0.5) * (float)y,
                     ((float)x_1 + 0.5) * (float)x);
          linearToSRGBIfNeeded((tcu *)&local_b8,pTVar3,(Vec4 *)local_c8);
          PixelBufferAccess::setPixel(dst,&local_b8,local_a8,local_a4,x_1);
        }
      }
    }
  }
  return;
}

Assistant:

void scale (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, Sampler::FilterMode filter)
{
	DE_ASSERT(filter == Sampler::NEAREST || filter == Sampler::LINEAR);

	Sampler sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE,
					filter, filter, 0.0f, false);

	float sX = (float)src.getWidth() / (float)dst.getWidth();
	float sY = (float)src.getHeight() / (float)dst.getHeight();
	float sZ = (float)src.getDepth() / (float)dst.getDepth();

	if (dst.getDepth() == 1 && src.getDepth() == 1)
	{
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			dst.setPixel(linearToSRGBIfNeeded(dst.getFormat(), src.sample2D(sampler, filter, ((float)x+0.5f)*sX, ((float)y+0.5f)*sY, 0)), x, y);
	}
	else
	{
		for (int z = 0; z < dst.getDepth(); z++)
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			dst.setPixel(linearToSRGBIfNeeded(dst.getFormat(), src.sample3D(sampler, filter, ((float)x+0.5f)*sX, ((float)y+0.5f)*sY, ((float)z+0.5f)*sZ)), x, y, z);
	}
}